

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stair_shuffle.c
# Opt level: O1

void clear_all_flags(void)

{
  dungeon_map *pdVar1;
  byte bVar2;
  dungeon_map *pdVar3;
  uint8_t (*pauVar4) [30];
  uint8_t (*pauVar5) [30];
  ulong uVar6;
  uint8_t (*pauVar7) [30];
  ulong uVar8;
  
  if (maps->index != '\0') {
    pauVar4 = maps->tiles;
    pdVar3 = maps;
    do {
      bVar2 = pdVar3->height;
      if ((ulong)bVar2 != 0) {
        uVar6 = 0;
        pauVar5 = pauVar4;
        do {
          if (pdVar3->width != '\0') {
            uVar8 = 0;
            pauVar7 = pauVar5;
            do {
              (*pauVar7)[0] = (*pauVar7)[0] & 7;
              uVar8 = uVar8 + 1;
              pauVar7 = pauVar7 + 1;
            } while (uVar8 < pdVar3->width);
          }
          uVar6 = uVar6 + 1;
          pauVar5 = (uint8_t (*) [30])(*pauVar5 + 1);
        } while (uVar6 != bVar2);
      }
      pauVar4 = (uint8_t (*) [30])((long)(pauVar4 + 0x1e) + 3);
      pdVar1 = pdVar3 + 1;
      pdVar3 = pdVar3 + 1;
    } while (pdVar1->index != '\0');
  }
  return;
}

Assistant:

static void clear_all_flags()
{
    dungeon_map *map;
    for (map = maps; map->index; map++) {
        clear_flags(map);
    }
}